

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSimplexNlaFreeze.cpp
# Opt level: O2

void __thiscall SimplexIterate::clear(SimplexIterate *this)

{
  pointer pdVar1;
  
  this->valid_ = false;
  SimplexBasis::clear(&this->basis_);
  InvertibleRepresentation::clear(&this->invert_);
  pdVar1 = (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar1) {
    (this->dual_edge_weight_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar1;
  }
  return;
}

Assistant:

void SimplexIterate::clear() {
  this->valid_ = false;
  this->basis_.clear();
  this->invert_.clear();
  this->dual_edge_weight_.clear();
}